

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O3

int Res_WinMarkPaths_rec(Abc_Obj_t *pNode,Abc_Obj_t *pPivot,int nLevelMin)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int Fill;
  int Fill_00;
  int Fill_01;
  long lVar5;
  int iVar6;
  uint uVar7;
  
  pAVar2 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,nLevelMin);
  if ((-1 < (long)iVar1) && (iVar1 < (pAVar2->vTravIds).nSize)) {
    pAVar3 = pNode->pNtk;
    uVar7 = 1;
    if ((pAVar2->vTravIds).pArray[iVar1] != pAVar3->nTravIds) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) goto LAB_0046e7f8;
      pAVar2 = pNode->pNtk;
      iVar6 = pAVar2->nTravIds + -1;
      uVar4 = 0;
      uVar7 = 0;
      if ((pAVar3->vTravIds).pArray[iVar1] != iVar6) {
        iVar1 = pNode->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,Fill_00);
        if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
LAB_0046e817:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar2->vTravIds).pArray[iVar1] = iVar6;
        uVar7 = uVar4;
        if (pNode != pPivot) {
          if (nLevelMin < (int)(*(uint *)&pNode->field_0x14 >> 0xc)) {
            if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                            ,0x105,"int Res_WinMarkPaths_rec(Abc_Obj_t *, Abc_Obj_t *, int)");
            }
            if (0 < (pNode->vFanins).nSize) {
              lVar5 = 0;
              uVar7 = 0;
              do {
                uVar4 = Res_WinMarkPaths_rec
                                  ((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]],pPivot
                                   ,nLevelMin);
                uVar7 = uVar7 | uVar4;
                lVar5 = lVar5 + 1;
              } while (lVar5 < (pNode->vFanins).nSize);
              if (uVar7 == 0) {
                uVar7 = 0;
              }
              else {
                pAVar2 = pNode->pNtk;
                iVar1 = pNode->Id;
                iVar6 = pAVar2->nTravIds;
                Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,Fill_01);
                if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) goto LAB_0046e817;
                (pAVar2->vTravIds).pArray[iVar1] = iVar6;
              }
            }
          }
        }
      }
    }
    return uVar7;
  }
LAB_0046e7f8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Res_WinMarkPaths_rec( Abc_Obj_t * pNode, Abc_Obj_t * pPivot, int nLevelMin )
{
    Abc_Obj_t * pFanin;
    int i, RetValue;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_NodeIsTravIdPrevious(pNode) )
        return 0;
    // assume that the node does not have access to the leaves
    Abc_NodeSetTravIdPrevious( pNode );
    // skip nodes below the given level
    if ( pNode == pPivot || (int)pNode->Level <= nLevelMin )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    // check if the fanins have access to the leaves
    RetValue = 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
        RetValue |= Res_WinMarkPaths_rec( pFanin, pPivot, nLevelMin );
    // relabel the node if it has access to the leaves
    if ( RetValue )
        Abc_NodeSetTravIdCurrent( pNode );
    return RetValue;
}